

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O2

bool cppcms::xss::anon_unknown_8::ends_with(char **begin,char *end,char *value)

{
  char *__s1;
  int iVar1;
  size_t __n;
  
  __n = strlen(value);
  __s1 = *begin;
  if ((__n <= (ulong)((long)end - (long)__s1) && __s1 < end) &&
     (iVar1 = bcmp(__s1,value,__n), iVar1 == 0)) {
    *begin = __s1 + __n;
    return true;
  }
  return false;
}

Assistant:

bool ends_with(char const *&begin,char const *end,char const *value)
		{
			size_t len=strlen(value);
			if(begin >= end || size_t(end - begin) < len)
				return false;
			if(memcmp(begin,value,len)==0) {
				begin+=len;
				return true;
			}
			return false;
		}